

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_extension_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExtensionOperator::Deserialize
          (LogicalExtensionOperator *this,Deserializer *deserializer)

{
  pointer puVar1;
  __type _Var2;
  ClientContext *context;
  DBConfig *pDVar3;
  pointer pOVar4;
  SerializationException *this_00;
  pointer this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension_name;
  
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  pDVar3 = DBConfig::GetConfig(context);
  Deserializer::ReadProperty<std::__cxx11::string>
            (&extension_name,deserializer,200,"extension_name");
  this_01 = (pDVar3->operator_extensions).
            super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pDVar3->operator_extensions).
           super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_01 == puVar1) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      ::std::operator+(&local_70,"No deserialization method exists for extension: ",&extension_name)
      ;
      SerializationException::SerializationException(this_00,&local_70);
      __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pOVar4 = unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>
             ::operator->(this_01);
    (*(code *)**(undefined8 **)pOVar4)(&local_70,pOVar4);
    _Var2 = ::std::operator==(&local_70,&extension_name);
    ::std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) break;
    this_01 = this_01 + 1;
  }
  pOVar4 = unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>
           ::operator->(this_01);
  (**(code **)(*(long *)pOVar4 + 8))(&local_70,pOVar4,deserializer);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_70._M_dataplus._M_p;
  ::std::__cxx11::string::~string((string *)&extension_name);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalExtensionOperator::Deserialize(Deserializer &deserializer) {
	auto &config = DBConfig::GetConfig(deserializer.Get<ClientContext &>());
	auto extension_name = deserializer.ReadProperty<string>(200, "extension_name");
	for (auto &extension : config.operator_extensions) {
		if (extension->GetName() == extension_name) {
			return extension->Deserialize(deserializer);
		}
	}
	throw SerializationException("No deserialization method exists for extension: " + extension_name);
}